

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O3

void __thiscall draco::ObjEncoder::EncodeFloat(ObjEncoder *this,float val)

{
  char *__s;
  EncoderBuffer *pEVar1;
  size_t sVar2;
  
  __s = this->num_buffer_;
  snprintf(__s,0x14,"%f",(double)val);
  pEVar1 = this->out_buffer_;
  if (0 < pEVar1->bit_encoder_reserved_bytes_) {
    return;
  }
  sVar2 = strlen(__s);
  std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
            ((vector<char,std::allocator<char>> *)pEVar1,
             (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,__s,__s + sVar2);
  return;
}

Assistant:

void ObjEncoder::EncodeFloat(float val) {
  snprintf(num_buffer_, sizeof(num_buffer_), "%f", val);
  buffer()->Encode(num_buffer_, strlen(num_buffer_));
}